

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_protocol_dispatch_incoming_commands(ENetHost *host,ENetEvent *event)

{
  ENetList *pEVar1;
  size_t *psVar2;
  ENetPeerState EVar3;
  _ENetListNode *p_Var4;
  _ENetListNode *p_Var5;
  _ENetHost *p_Var6;
  ENetPacket *pEVar7;
  ENetListIterator result;
  ENetPeer *peer;
  
  pEVar1 = &host->dispatchQueue;
  peer = (ENetPeer *)(host->dispatchQueue).sentinel.next;
  if (peer != (ENetPeer *)pEVar1) {
    do {
      p_Var4 = (peer->dispatchList).next;
      p_Var5 = (peer->dispatchList).previous;
      p_Var5->next = p_Var4;
      p_Var4->previous = p_Var5;
      peer->needsDispatch = 0;
      EVar3 = peer->state;
      if (EVar3 == ENET_PEER_STATE_CONNECTED) {
        if ((peer->dispatchedCommands).sentinel.next != &(peer->dispatchedCommands).sentinel) {
          pEVar7 = enet_peer_receive(peer,&event->channelID);
          event->packet = pEVar7;
          if (pEVar7 != (ENetPacket *)0x0) {
            event->type = ENET_EVENT_TYPE_RECEIVE;
            event->peer = peer;
            if ((peer->dispatchedCommands).sentinel.next == &(peer->dispatchedCommands).sentinel) {
              return 1;
            }
            peer->needsDispatch = 1;
            p_Var4 = (host->dispatchQueue).sentinel.previous;
            (peer->dispatchList).previous = p_Var4;
            (peer->dispatchList).next = &pEVar1->sentinel;
            p_Var4->next = &peer->dispatchList;
            (host->dispatchQueue).sentinel.previous = &peer->dispatchList;
            return 1;
          }
        }
      }
      else {
        if (EVar3 - ENET_PEER_STATE_CONNECTION_PENDING < 2) {
          p_Var6 = peer->host;
          if (peer->incomingBandwidth != 0) {
            psVar2 = &p_Var6->bandwidthLimitedPeers;
            *psVar2 = *psVar2 + 1;
          }
          psVar2 = &p_Var6->connectedPeers;
          *psVar2 = *psVar2 + 1;
          peer->state = ENET_PEER_STATE_CONNECTED;
          event->type = ENET_EVENT_TYPE_CONNECT;
          event->peer = peer;
          event->data = peer->eventData;
          return 1;
        }
        if (EVar3 == ENET_PEER_STATE_ZOMBIE) {
          host->recalculateBandwidthLimits = 1;
          event->type = ENET_EVENT_TYPE_DISCONNECT;
          event->peer = peer;
          event->data = peer->eventData;
          enet_peer_reset(peer);
          return 1;
        }
      }
      peer = (ENetPeer *)(pEVar1->sentinel).next;
    } while (peer != (ENetPeer *)pEVar1);
  }
  return 0;
}

Assistant:

static int enet_protocol_dispatch_incoming_commands(ENetHost* host, ENetEvent* event) {
	while (!enet_list_empty(&host->dispatchQueue)) {
		ENetPeer* peer = (ENetPeer*)enet_list_remove(enet_list_begin(&host->dispatchQueue));
		peer->needsDispatch = 0;

		switch (peer->state) {
		case ENET_PEER_STATE_CONNECTION_PENDING:
		case ENET_PEER_STATE_CONNECTION_SUCCEEDED:
			enet_protocol_change_state(host, peer, ENET_PEER_STATE_CONNECTED);

			event->type = ENET_EVENT_TYPE_CONNECT;
			event->peer = peer;
			event->data = peer->eventData;

			return 1;

		case ENET_PEER_STATE_ZOMBIE:
			host->recalculateBandwidthLimits = 1;
			event->type = ENET_EVENT_TYPE_DISCONNECT;
			event->peer = peer;
			event->data = peer->eventData;

			enet_peer_reset(peer);

			return 1;

		case ENET_PEER_STATE_CONNECTED:
			if (enet_list_empty(&peer->dispatchedCommands))
				continue;

			event->packet = enet_peer_receive(peer, &event->channelID);

			if (event->packet == NULL)
				continue;

			event->type = ENET_EVENT_TYPE_RECEIVE;
			event->peer = peer;

			if (!enet_list_empty(&peer->dispatchedCommands)) {
				peer->needsDispatch = 1;

				enet_list_insert(enet_list_end(&host->dispatchQueue), &peer->dispatchList);
			}

			return 1;

		default:
			break;
		}
	}

	return 0;
}